

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_pack_s16_u8(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  c_v128 cVar15;
  
  auVar13 = vpinsrd_avx(ZEXT416(a.u32[3]),a.u64[1]._2_4_,1);
  auVar13 = vpinsrd_avx(auVar13,a.u32[2],2);
  iVar12 = a.s32[1] >> 0x10;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (0xfe < iVar12) {
    iVar12 = 0xff;
  }
  iVar4 = a.s64[0]._2_4_ >> 0x10;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  uVar7 = a.s32[0] >> 0x10;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  uVar8 = (uint)a.s16[0];
  if (0xfe < (int)uVar7) {
    uVar7 = 0xff;
  }
  if (a.s16[0] < 1) {
    uVar8 = 0;
  }
  if (0xfe < (int)uVar8) {
    uVar8 = 0xff;
  }
  auVar13 = vpinsrd_avx(auVar13,a.u32[2] << 0x10,3);
  auVar13 = vpsrad_avx(auVar13,0x10);
  auVar13 = vpmaxsd_avx(auVar13,(undefined1  [16])0x0);
  auVar14._8_4_ = 0xff;
  auVar14._0_8_ = 0xff000000ff;
  auVar14._12_4_ = 0xff;
  auVar13 = vpminsd_avx(auVar13,auVar14);
  auVar3 = vpmovzxdq_avx2(auVar13);
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x20283038));
  auVar3 = vpsllvq_avx2(auVar3,auVar2);
  auVar13 = vpor_avx(auVar3._0_16_,auVar3._16_16_);
  auVar1 = vpshufd_avx(auVar13,0xee);
  auVar1 = vpor_avx(auVar13,auVar1);
  auVar13 = vpinsrd_avx(ZEXT416(b.u32[3]),b.u64[1]._2_4_,1);
  auVar13 = vpinsrd_avx(auVar13,b.u32[2],2);
  iVar6 = b.s32[1] >> 0x10;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  uVar11 = 0xff;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar9 = b.s64[0]._2_4_ >> 0x10;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  if (0xfe < (int)uVar9) {
    uVar9 = uVar11;
  }
  uVar5 = b.s32[0] >> 0x10;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  if (0xfe < (int)uVar5) {
    uVar5 = uVar11;
  }
  uVar10 = 0;
  if (0 < b.s16[0]) {
    uVar10 = (int)b.s16[0];
  }
  if (0xfe < (int)uVar10) {
    uVar10 = uVar11;
  }
  auVar13 = vpinsrd_avx(auVar13,b.u32[2] << 0x10,3);
  auVar13 = vpsrad_avx(auVar13,0x10);
  auVar13 = vpmaxsd_avx(auVar13,(undefined1  [16])0x0);
  auVar13 = vpminsd_avx(auVar13,auVar14);
  auVar3 = vpmovzxdq_avx2(auVar13);
  auVar2 = vpsllvq_avx2(auVar3,auVar2);
  auVar13 = vpor_avx(auVar2._0_16_,auVar2._16_16_);
  auVar14 = vpshufd_avx(auVar13,0xee);
  auVar13 = vpor_avx(auVar13,auVar14);
  cVar15._0_8_ = (ulong)(uVar5 << 8 | uVar9 << 0x10 | iVar6 << 0x18 | uVar10) | auVar13._0_8_;
  cVar15.u64[1] = (ulong)(uVar7 << 8 | iVar4 << 0x10 | iVar12 << 0x18 | uVar8) | auVar1._0_8_;
  return cVar15;
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s16_u8(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.u8[7] = SIMD_CLAMP(a.s16[3], 0, 255);
  t.u8[6] = SIMD_CLAMP(a.s16[2], 0, 255);
  t.u8[5] = SIMD_CLAMP(a.s16[1], 0, 255);
  t.u8[4] = SIMD_CLAMP(a.s16[0], 0, 255);
  t.u8[3] = SIMD_CLAMP(b.s16[3], 0, 255);
  t.u8[2] = SIMD_CLAMP(b.s16[2], 0, 255);
  t.u8[1] = SIMD_CLAMP(b.s16[1], 0, 255);
  t.u8[0] = SIMD_CLAMP(b.s16[0], 0, 255);
  return t;
}